

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O1

void __thiscall
mocker::nasm::Section::
emplaceInst<mocker::nasm::Set,mocker::nasm::Set::OpType_const&,std::shared_ptr<mocker::nasm::Register>const&>
          (Section *this,OpType *args,shared_ptr<mocker::nasm::Register> *args_1)

{
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  emplaceLine<mocker::nasm::Set,mocker::nasm::Set::OpType_const&,std::shared_ptr<mocker::nasm::Register>const&>
            (this,&local_48,args,args_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    emplaceLine<Type>("", std::forward<Args>(args)...);
  }